

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall
sqlite_orm::internal::object_from_column_builder<relive::Url>::operator()
          (object_from_column_builder<relive::Url> *this,
          column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long)>
          *c)

{
  code *UNRECOVERED_JUMPTABLE;
  long lVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  
  (this->super_object_from_column_builder_base).index =
       (this->super_object_from_column_builder_base).index + 1;
  auVar3 = sqlite3_column_int64((this->super_object_from_column_builder_base).stmt);
  lVar1 = auVar3._8_8_;
  if (c->member_pointer != 0xffffffffffffffff) {
    *(long *)((long)&this->object->_id + c->member_pointer) = auVar3._0_8_;
    return;
  }
  UNRECOVERED_JUMPTABLE = (code *)c->setter;
  plVar2 = (long *)((long)&this->object->_id + *(long *)&c->field_0x40);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    lVar1 = *plVar2;
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + lVar1 + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(plVar2,auVar3._0_8_,lVar1,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void operator()(const C &c) const {
        using field_type = typename C::field_type;
        auto value = row_extractor<field_type>().extract(this->stmt, this->index++);
        if(c.member_pointer) {
            this->object.*c.member_pointer = std::move(value);
        } else {
            ((this->object).*(c.setter))(std::move(value));
        }
    }